

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::strTree<kj::String,kj::StringPtr&,kj::StringTree>
          (StringTree *__return_storage_ptr__,kj *this,String *params,StringPtr *params_1,
          StringTree *params_2)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringTree local_50;
  char *local_18;
  char *local_10;
  
  local_50.text.content.size_ = *(size_t *)(this + 8);
  local_50.size_ = 0;
  if (local_50.text.content.size_ != 0) {
    local_50.size_ = local_50.text.content.size_ - 1;
  }
  local_50.text.content.ptr = *(char **)this;
  local_50.text.content.disposer = *(ArrayDisposer **)(this + 0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_50.branches.ptr = (Branch *)0x0;
  local_50.branches.size_ = 0;
  local_50.branches.disposer = (ArrayDisposer *)0x0;
  local_18 = (params->content).ptr;
  local_10 = (char *)((params->content).size_ - 1);
  StringTree::concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,&local_50,(StringTree *)&stack0xffffffffffffffe8,
             &params_1->content,(StringTree *)local_50.text.content.ptr);
  sVar2 = local_50.branches.size_;
  pBVar3 = local_50.branches.ptr;
  if (local_50.branches.ptr != (Branch *)0x0) {
    local_50.branches.ptr = (Branch *)0x0;
    local_50.branches.size_ = 0;
    (**(local_50.branches.disposer)->_vptr_ArrayDisposer)
              (local_50.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  sVar2 = local_50.text.content.size_;
  pcVar1 = local_50.text.content.ptr;
  if ((StringTree *)local_50.text.content.ptr != (StringTree *)0x0) {
    local_50.text.content.ptr = (char *)0x0;
    local_50.text.content.size_ = 0;
    (**(local_50.text.content.disposer)->_vptr_ArrayDisposer)
              (local_50.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}